

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],int *params_2,
          char (*params_3) [3],int *params_4,char (*params_5) [3],LogSeverity *params_6,
          char (*params_7) [3],String *params_8)

{
  char **value;
  char (*value_00) [2];
  kj *pkVar1;
  char (*pacVar2) [3];
  LogSeverity *value_01;
  String *value_02;
  int *value_03;
  int *value_04;
  ArrayPtr<const_char> *in_stack_ffffffffffffff08;
  ArrayPtr<const_char> local_e0;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  CappedArray<char,_14UL> local_a0;
  ArrayPtr<const_char> local_88;
  CappedArray<char,_14UL> local_78;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  char (*local_40) [3];
  int *params_local_4;
  char (*params_local_3) [3];
  int *params_local_2;
  char (*params_local_1) [2];
  char **params_local;
  
  local_40 = params_3;
  params_local_4 = params_2;
  params_local_3 = (char (*) [3])params_1;
  params_local_2 = (int *)params;
  params_local_1 = (char (*) [2])this;
  params_local = (char **)__return_storage_ptr__;
  value = fwd<char_const*&>((char **)this);
  local_50 = toCharSequence<char_const*&>(value);
  value_00 = ::const((char (*) [2])params_local_2);
  local_60 = toCharSequence<char_const(&)[2]>(value_00);
  pkVar1 = (kj *)fwd<int&>((int *)params_local_3);
  toCharSequence<int&>(&local_78,pkVar1,value_03);
  pacVar2 = ::const((char (*) [3])params_local_4);
  local_88 = toCharSequence<char_const(&)[3]>(pacVar2);
  pkVar1 = (kj *)fwd<int&>((int *)local_40);
  toCharSequence<int&>(&local_a0,pkVar1,value_04);
  pacVar2 = ::const((char (*) [3])params_4);
  local_b0 = toCharSequence<char_const(&)[3]>(pacVar2);
  value_01 = fwd<kj::LogSeverity&>((LogSeverity *)params_5);
  local_c0 = (ArrayPtr<const_char>)toCharSequence<kj::LogSeverity&>(value_01);
  pacVar2 = ::const((char (*) [3])params_6);
  local_d0 = toCharSequence<char_const(&)[3]>(pacVar2);
  value_02 = fwd<kj::String>((NoInfer<kj::String> *)params_7);
  local_e0 = toCharSequence<kj::String>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_50,&local_60,(ArrayPtr<const_char> *)&local_78,
             (CappedArray<char,_14UL> *)&local_88,(ArrayPtr<const_char> *)&local_a0,
             (CappedArray<char,_14UL> *)&local_b0,&local_c0,(StringPtr *)&local_d0,&local_e0,
             in_stack_ffffffffffffff08);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}